

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

uint dxil_spv::raw_buffer_data_type_to_addr_shift_log2(Impl *impl,Type *data_type)

{
  bool bVar1;
  
  if (((impl->execution_mode_meta).native_16bit_operations == true) &&
     (bVar1 = type_is_16bit(data_type), bVar1)) {
    return 1;
  }
  bVar1 = type_is_64bit(data_type);
  return bVar1 | 2;
}

Assistant:

unsigned raw_buffer_data_type_to_addr_shift_log2(Converter::Impl &impl, const llvm::Type *data_type)
{
	// A 16-bit raw load is only actually 16-bit if native 16-bit operations are enabled.
	if (impl.execution_mode_meta.native_16bit_operations && type_is_16bit(data_type))
		return 1;
	else if (type_is_64bit(data_type))
		return 3;
	else
		return 2;
}